

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsGearbox.cpp
# Opt level: O2

void __thiscall chrono::ChShaftsGearbox::ConstraintsLoadJacobians(ChShaftsGearbox *this)

{
  ChConstraintThreeGeneric *this_00;
  Scalar SVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Scalar *pSVar6;
  DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::InnerStride<1>_>,_1>
  local_38 [32];
  
  SVar1 = this->r1;
  this_00 = &this->constraint;
  ChConstraintThreeGeneric::Get_Cq_a((ChRowVectorRef *)local_38,this_00);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,0);
  *pSVar6 = SVar1;
  SVar1 = this->r2;
  ChConstraintThreeGeneric::Get_Cq_b((ChRowVectorRef *)local_38,this_00);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,0);
  *pSVar6 = SVar1;
  dVar2 = (this->shaft_dir).m_data[0];
  dVar3 = (this->shaft_dir).m_data[1];
  dVar4 = (this->shaft_dir).m_data[2];
  ChConstraintThreeGeneric::Get_Cq_c((ChRowVectorRef *)local_38,this_00);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,0);
  *pSVar6 = 0.0;
  ChConstraintThreeGeneric::Get_Cq_c((ChRowVectorRef *)local_38,this_00);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,1);
  *pSVar6 = 0.0;
  ChConstraintThreeGeneric::Get_Cq_c((ChRowVectorRef *)local_38,this_00);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,2);
  *pSVar6 = 0.0;
  dVar5 = this->r3;
  ChConstraintThreeGeneric::Get_Cq_c((ChRowVectorRef *)local_38,this_00);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,3);
  *pSVar6 = dVar2 * dVar5;
  dVar2 = this->r3;
  ChConstraintThreeGeneric::Get_Cq_c((ChRowVectorRef *)local_38,this_00);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,4);
  *pSVar6 = dVar3 * dVar2;
  dVar2 = this->r3;
  ChConstraintThreeGeneric::Get_Cq_c((ChRowVectorRef *)local_38,this_00);
  pSVar6 = Eigen::
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()(local_38,5);
  *pSVar6 = dVar4 * dVar2;
  return;
}

Assistant:

void ChShaftsGearbox::ConstraintsLoadJacobians() {
    // compute jacobians
    constraint.Get_Cq_a()(0) = r1;
    constraint.Get_Cq_b()(0) = r2;

    // ChVector<> jacw = body->TransformDirectionParentToLocal(shaft_dir);
    ChVector<> jacw = shaft_dir;

    constraint.Get_Cq_c()(0) = 0;
    constraint.Get_Cq_c()(1) = 0;
    constraint.Get_Cq_c()(2) = 0;
    constraint.Get_Cq_c()(3) = jacw.x() * r3;
    constraint.Get_Cq_c()(4) = jacw.y() * r3;
    constraint.Get_Cq_c()(5) = jacw.z() * r3;
}